

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

size_t binary_fuse_sort_and_remove_dup(uint64_t *keys,size_t length)

{
  ulong in_RSI;
  void *in_RDI;
  size_t i;
  size_t j;
  ulong local_20;
  size_t local_18;
  
  qsort(in_RDI,in_RSI,8,binary_fuse_cmpfunc);
  local_18 = 1;
  for (local_20 = 1; local_20 < in_RSI; local_20 = local_20 + 1) {
    if (*(long *)((long)in_RDI + local_20 * 8) != *(long *)((long)in_RDI + (local_20 - 1) * 8)) {
      *(undefined8 *)((long)in_RDI + local_18 * 8) = *(undefined8 *)((long)in_RDI + local_20 * 8);
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

static size_t binary_fuse_sort_and_remove_dup(uint64_t* keys, size_t length) {
  qsort(keys, length, sizeof(uint64_t), binary_fuse_cmpfunc);
  size_t j = 1;
  for(size_t i = 1; i < length; i++) {
    if(keys[i] != keys[i-1]) {
      keys[j] = keys[i];
      j++;
    }
  }
  return j;
}